

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureHeartBeatInterval_TimeOutWaitingForHeartBeatHelper::
~initiatorFixtureHeartBeatInterval_TimeOutWaitingForHeartBeatHelper
          (initiatorFixtureHeartBeatInterval_TimeOutWaitingForHeartBeatHelper *this)

{
  initiatorFixtureHeartBeatInterval_TimeOutWaitingForHeartBeatHelper *this_local;
  
  ~initiatorFixtureHeartBeatInterval_TimeOutWaitingForHeartBeatHelper(this);
  operator_delete(this,0x630);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, HeartBeatInterval_TimeOutWaitingForHeartBeat) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );
  createSession(1, 0, 31);

  UtcTimeStamp time;

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  //Force Heartbeat Timeout
  process_sleep(3);

  object->next();
  CHECK(!object->isLoggedOn());
}